

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O2

int cvBuildNordsieckArrayAdams
              (sunrealtype *t,N_Vector y,N_Vector *f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  N_Vector *pp_Var1;
  undefined4 in_EAX;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  int j;
  double dVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar8._4_4_ = -(uint)(y == (N_Vector)0x0);
  auVar8._8_4_ = -(uint)(f == (N_Vector *)0x0);
  auVar8._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar2 = movmskps(in_EAX,auVar8);
  if ((zn != (N_Vector *)0x0 && 0 < order) && iVar2 == 0) {
    uVar5 = (ulong)(uint)order;
    uVar6 = 0;
    do {
      if (uVar5 == uVar6) {
        if (1 < order) {
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            N_VScale(0x3ff0000000000000,f[uVar6],wrk[uVar6]);
          }
          for (uVar6 = 1; uVar3 = uVar5, uVar6 != uVar5; uVar6 = uVar6 + 1) {
            while ((long)uVar6 < (long)uVar3) {
              dVar7 = 1.0 / (t[(uVar3 - 1) - uVar6] - t[uVar3 - 1]);
              N_VLinearSum(dVar7,-dVar7,wrk[uVar3 - 2],wrk[uVar3 - 1]);
              uVar3 = uVar3 - 1;
            }
          }
          N_VScale(0x3ff0000000000000,wrk[order - 1],zn[1]);
          for (uVar6 = 2; order + 1 != uVar6; uVar6 = uVar6 + 1) {
            N_VConst(zn[uVar6]);
          }
          for (uVar4 = order - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
            for (uVar6 = (ulong)(order - 1); 0 < (long)uVar6; uVar6 = uVar6 - 1) {
              N_VLinearSum(*t - t[uVar4],(double)(int)uVar6,zn[uVar6 + 1],zn[uVar6],zn[uVar6 + 1]);
            }
            N_VLinearSum(*t - t[uVar4],0x3ff0000000000000,zn[1],wrk[uVar4],zn[1]);
          }
        }
        N_VScale(0x3ff0000000000000,y,*zn);
        N_VScale(0x3ff0000000000000,*f,zn[1]);
        for (uVar6 = 1; order + 1 != uVar6; uVar6 = uVar6 + 1) {
          N_VScale(zn[uVar6],zn[uVar6]);
        }
        return 0;
      }
    } while ((f[uVar6] != (N_Vector)0x0) &&
            (pp_Var1 = wrk + uVar6, uVar6 = uVar6 + 1, *pp_Var1 != (N_Vector)0x0));
  }
  return -0x16;
}

Assistant:

static int cvBuildNordsieckArrayAdams(sunrealtype* t, N_Vector y, N_Vector* f,
                                      N_Vector* wrk, int order,
                                      sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!f[i]) { return CV_ILL_INPUT; }
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Compute Newton polynomial coefficients interpolating f history */
    for (int i = 0; i < order; i++) { N_VScale(ONE, f[i], wrk[i]); }

    for (int i = 1; i < order; i++)
    {
      for (int j = order - 1; j >= i; j--)
      {
        /* Divided difference */
        sunrealtype delta_t = ONE / (t[j - i] - t[j]);
        N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
      }
    }

    /* Compute derivatives of Newton polynomial of f history */
    N_VScale(ONE, wrk[order - 1], zn[1]);
    for (int i = 2; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 2; i >= 0; i--)
    {
      for (int j = order - 1; j > 0; j--)
      {
        N_VLinearSum(t[0] - t[i], zn[j + 1], j, zn[j], zn[j + 1]);
      }
      N_VLinearSum(t[0] - t[i], zn[1], ONE, wrk[i], zn[1]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y, zn[0]);
  N_VScale(ONE, f[0], zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}